

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfMw.c
# Opt level: O0

sbfMw sbfMw_create(sbfLog log,sbfKeyValue properties)

{
  int iVar1;
  char *__nptr;
  sbfKeyValue psVar2;
  sbfMwThread psVar3;
  undefined8 uVar4;
  event_base *peVar5;
  undefined8 in_RSI;
  sbfLog in_RDI;
  event_config *ec;
  sbfMwThread thread;
  u_int i;
  int threads;
  char *value;
  sbfMw mw;
  undefined8 in_stack_ffffffffffffffc0;
  uint uVar6;
  u_int fd;
  sbfMw local_8;
  
  sbfMw_checkSupported((uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  __nptr = (char *)sbfKeyValue_get(in_RSI,"threads");
  if (__nptr == (char *)0x0) {
    fd = 1;
  }
  else {
    fd = atoi(__nptr);
  }
  if (((int)fd < 1) || (0x40 < (int)fd)) {
    local_8 = (sbfMw)0x0;
  }
  else {
    signal(0xd,(__sighandler_t)0x1);
    local_8 = (sbfMw)sbfMemory_calloc(1,0x20);
    psVar2 = (sbfKeyValue)sbfKeyValue_copy(in_RSI);
    local_8->mProperties = psVar2;
    local_8->mLog = in_RDI;
    local_8->mNumThreads = fd;
    psVar3 = (sbfMwThread)sbfMemory_calloc(local_8->mNumThreads,0xa0);
    local_8->mThreads = psVar3;
    sbfLog_log(local_8->mLog,1,"this is version 0.0.2");
    sbfLog_log(local_8->mLog,0,"creating middleware %p, using %u threads",local_8,fd);
    iVar1 = evthread_use_pthreads();
    if (iVar1 != 0) {
      sbfFatal_die("event_use_pthreads failed");
    }
    uVar4 = event_config_new();
    event_config_set_flag(uVar4,0x10);
    for (uVar6 = 0; uVar6 < local_8->mNumThreads; uVar6 = uVar6 + 1) {
      psVar3 = local_8->mThreads + uVar6;
      psVar3->mParent = local_8;
      psVar3->mIndex = uVar6;
      peVar5 = (event_base *)event_base_new_with_config(uVar4);
      psVar3->mEventBase = peVar5;
      if (psVar3->mEventBase == (event_base *)0x0) {
        sbfFatal_die("event_base_new failed");
      }
      event_assign(&psVar3->mTimer,psVar3->mEventBase,0xffffffff,0,sbfMwEventBaseTimerCb,psVar3);
      sbfMwEventBaseTimerCb(fd,(short)(uVar6 >> 0x10),psVar3);
      iVar1 = pthread_create(&psVar3->mThread,(pthread_attr_t *)0x0,sbfMwEventBaseThreadCb,psVar3);
      if (iVar1 != 0) {
        sbfFatal_die("sbfThread_create failed");
      }
    }
    event_config_free(uVar4);
  }
  return local_8;
}

Assistant:

sbfMw
sbfMw_create (sbfLog log, sbfKeyValue properties)
{
    sbfMw                mw;
    const char*          value;
    int                  threads;
    u_int                i;
    sbfMwThread          thread;
    struct event_config* ec;
#ifdef WIN32
    WSADATA              wsd;
#endif

    // Check all the supported capabilities
    sbfMw_checkSupported (CAP_ALL_MASK);
    
    value = sbfKeyValue_get (properties, "threads");
    if (value == NULL)
        threads = 1;
    else
        threads = atoi (value);
    if (threads <= 0 || threads > SBF_MW_THREAD_LIMIT)
        return NULL;

#ifndef WIN32
    signal (SIGPIPE, SIG_IGN);
#endif

    mw = xcalloc (1, sizeof *mw);
    mw->mProperties = sbfKeyValue_copy (properties);
    mw->mLog = log;
    mw->mNumThreads = threads;
    mw->mThreads = xcalloc (mw->mNumThreads, sizeof *mw->mThreads);

    sbfLog_info (mw->mLog, "this is version " SBF_VERSION);
    sbfLog_debug (mw->mLog,
                  "creating middleware %p, using %u threads",
                  mw,
                  threads);

#ifdef WIN32
    if (WSAStartup (MAKEWORD (2, 2), &wsd) != 0)
        SBF_FATAL ("WSAStartup failed");
    if (evthread_use_windows_threads () != 0)
        SBF_FATAL ("event_use_windows_threads failed");
#else
    if (evthread_use_pthreads () != 0)
        SBF_FATAL ("event_use_pthreads failed");
#endif

    ec = event_config_new ();
    event_config_set_flag (ec, EVENT_BASE_FLAG_EPOLL_USE_CHANGELIST);

    for (i = 0; i < mw->mNumThreads; i++)
    {
        thread = &mw->mThreads[i];
        thread->mParent = mw;
        thread->mIndex = i;

        thread->mEventBase = event_base_new_with_config (ec);
        if (thread->mEventBase == NULL)
            SBF_FATAL ("event_base_new failed");

        event_assign (&thread->mTimer,
                      thread->mEventBase,
                      -1,
                      0,
                      sbfMwEventBaseTimerCb,
                      thread);
        sbfMwEventBaseTimerCb (-1, 0, thread);

        if (sbfThread_create (&thread->mThread,
                              sbfMwEventBaseThreadCb,
                              thread) != 0)
            SBF_FATAL ("sbfThread_create failed");
    }

    event_config_free (ec);
    return mw;
}